

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fq.cpp
# Opt level: O0

void __thiscall zmq::fq_t::pipe_terminated(fq_t *this,pipe_t *pipe_)

{
  pipe_t *item_;
  array_t<zmq::pipe_t,_1> *in_RSI;
  long in_RDI;
  size_type unaff_retaddr;
  size_type in_stack_00000008;
  size_type index;
  
  item_ = (pipe_t *)array_t<zmq::pipe_t,_1>::index((char *)in_RSI,(int)in_RSI);
  if (item_ < *(pipe_t **)(in_RDI + 0x18)) {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -1;
    array_t<zmq::pipe_t,_1>::swap((array_t<zmq::pipe_t,_1> *)index,in_stack_00000008,unaff_retaddr);
    if (*(long *)(in_RDI + 0x28) == *(long *)(in_RDI + 0x18)) {
      *(undefined8 *)(in_RDI + 0x28) = 0;
    }
  }
  array_t<zmq::pipe_t,_1>::erase(in_RSI,item_);
  if (*(array_t<zmq::pipe_t,_1> **)(in_RDI + 0x20) == in_RSI) {
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  return;
}

Assistant:

void zmq::fq_t::pipe_terminated (pipe_t *pipe_)
{
    const pipes_t::size_type index = _pipes.index (pipe_);

    //  Remove the pipe from the list; adjust number of active pipes
    //  accordingly.
    if (index < _active) {
        _active--;
        _pipes.swap (index, _active);
        if (_current == _active)
            _current = 0;
    }
    _pipes.erase (pipe_);

    if (_last_in == pipe_) {
        _last_in = NULL;
    }
}